

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Dictionary.cc
# Opt level: O2

void __thiscall
QPDFObjectHandle::replaceKey(QPDFObjectHandle *this,string *key,QPDFObjectHandle *value)

{
  Dictionary dict;
  allocator<char> local_51;
  string local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  as_dictionary((QPDFObjectHandle *)&local_50,(typed)this);
  if (local_50._M_dataplus._M_p == (pointer)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"ignoring key replacement request",&local_51);
    typeWarning(this,"dictionary",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    checkOwnership(this,value);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)value);
    ::qpdf::BaseDictionary::replaceKey
              ((BaseDictionary *)&local_50,key,(QPDFObjectHandle *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50._M_string_length);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::replaceKey(std::string const& key, QPDFObjectHandle const& value)
{
    if (auto dict = as_dictionary(strict)) {
        checkOwnership(value);
        dict.replaceKey(key, value);
        return;
    }
    typeWarning("dictionary", "ignoring key replacement request");
    QTC::TC("qpdf", "QPDFObjectHandle dictionary ignoring replaceKey");
}